

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,
          TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *gel)

{
  long in_RSI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide *in_stack_00000028;
  TPZGeoElSide *in_stack_00000030;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff30;
  void **in_stack_ffffffffffffff38;
  TPZGeoMesh *in_stack_ffffffffffffff40;
  TPZGeoElSideIndex *in_stack_ffffffffffffff48;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  TPZGeoEl *local_80;
  TPZGeoBlend<pzgeom::TPZGeoPrism> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffd4;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02452a90);
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02452778;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02452778;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend
            ((TPZGeoBlend<pzgeom::TPZGeoPrism> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  local_80 = in_RDI + 0x70;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff30);
    local_80 = (TPZGeoEl *)&local_80->fMatId;
  } while (local_80 != (TPZGeoEl *)&in_RDI[0x77].fNumInterfaces);
  for (iVar1 = 0; iVar1 < 0x15; iVar1 = iVar1 + 1) {
    TPZGeoEl::Mesh(in_RDI);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff48 = (TPZGeoElSideIndex *)(in_RSI + 0x1c00 + (long)iVar1 * 0x18);
    in_stack_ffffffffffffff50 = TPZGeoEl::Mesh(in_RDI);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    TPZGeoElSide::SetConnectivity(in_stack_00000030,in_stack_00000028);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16ced0d);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16ced1a);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}